

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_func.h
# Opt level: O3

NDArray __thiscall tvm::runtime::TVMPODValue_::operator_cast_to_NDArray(TVMPODValue_ *this)

{
  DLDeviceType DVar1;
  TVMContext TVar2;
  ostream *poVar3;
  size_t sVar4;
  TVMContext *in_RSI;
  char *__s;
  LogCheckError _check_err;
  LogCheckError local_338;
  LogMessageFatal local_330;
  LogMessageFatal local_1a8;
  
  if (in_RSI[1].device_type == kDLOpenCL) {
    (this->value_).v_int64 = 0;
  }
  else {
    local_1a8.log_stream_ = (ostringstream)0xd;
    local_1a8._1_3_ = 0;
    dmlc::LogCheck_EQ<int,TVMTypeCode>
              ((dmlc *)&local_338,(int *)(in_RSI + 1),(anon_enum_32 *)&local_1a8);
    if (local_338.str != (string *)0x0) {
      dmlc::LogMessageFatal::LogMessageFatal
                (&local_330,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/include/tvm/runtime/packed_func.h"
                 ,0x1d8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,"Check failed: ",0xe)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_330,"type_code_ == kNDArrayContainer",0x1f);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_330,((local_338.str)->_M_dataplus)._M_p,
                          (local_338.str)->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," expected ",10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"NDArrayContainer",0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," but get ",9);
      DVar1 = in_RSI[1].device_type;
      if ((ulong)DVar1 < 0xe) {
        __s = *(char **)(&DAT_0014ac18 + (ulong)DVar1 * 8);
      }
      else {
        dmlc::LogMessageFatal::LogMessageFatal
                  (&local_1a8,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/include/tvm/runtime/packed_func.h"
                   ,0x3ab);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"unknown type_code=",0x12);
        std::ostream::operator<<(&local_1a8,DVar1);
        dmlc::LogMessageFatal::~LogMessageFatal(&local_1a8);
        __s = "";
      }
      sVar4 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar4);
      dmlc::LogMessageFatal::~LogMessageFatal(&local_330);
    }
    dmlc::LogCheckError::~LogCheckError(&local_338);
    TVar2 = *in_RSI;
    (this->value_).v_ctx = TVar2;
    if (TVar2 != (TVMContext)0x0) {
      LOCK();
      *(int *)((long)TVar2 + 0x44) = *(int *)((long)TVar2 + 0x44) + 1;
      UNLOCK();
    }
  }
  return (NDArray)(Container *)this;
}

Assistant:

operator NDArray() const {
    if (type_code_ == kNull)
      return NDArray();
    TVM_CHECK_TYPE_CODE(type_code_, kNDArrayContainer);
    return NDArray(static_cast<NDArray::Container *>(value_.v_handle));
  }